

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net.cpp
# Opt level: O3

int __thiscall ncnn::Net::load_param_bin(Net *this,DataReader *dr)

{
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *pvVar1;
  undefined8 *puVar2;
  int iVar3;
  pointer pBVar4;
  int *piVar5;
  Allocator *pAVar6;
  pointer pMVar7;
  long *plVar8;
  Net *pNVar9;
  int iVar10;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  Layer *pLVar11;
  undefined4 extraout_var_05;
  undefined4 extraout_var_06;
  undefined4 extraout_var_07;
  Mat *pMVar12;
  int iVar13;
  long lVar14;
  int *piVar15;
  void *pvVar16;
  int iVar17;
  int iVar18;
  size_t sVar19;
  ulong uVar20;
  long lVar21;
  int top_count;
  int bottom_count;
  int typeindex;
  int blob_count;
  int layer_count;
  int magic;
  ParamDict pd;
  int bottom_blob_index;
  int local_130;
  int local_12c;
  Net *local_128;
  int local_120;
  uint local_11c;
  int local_118;
  int local_114;
  ulong local_110;
  Layer *local_108;
  vector<int,_std::allocator<int>_> *local_100;
  int local_f4;
  vector<int,_std::allocator<int>_> *local_f0;
  ParamDict local_e8;
  Mat *local_d8;
  DataReader *local_d0;
  ulong local_c8;
  Mat local_c0;
  Mat local_78;
  
  local_f4 = 0;
  local_128 = this;
  iVar10 = (*dr->_vptr_DataReader[3])(dr,&local_f4,4);
  if (CONCAT44(extraout_var,iVar10) == 4) {
    if (local_f4 == 0x7685dd) {
      local_114 = 0;
      local_118 = 0;
      iVar10 = (*dr->_vptr_DataReader[3])(dr,&local_114,4);
      if (CONCAT44(extraout_var_00,iVar10) == 4) {
        iVar10 = (*dr->_vptr_DataReader[3])(dr,&local_118,4);
        pNVar9 = local_128;
        if (CONCAT44(extraout_var_01,iVar10) == 4) {
          if ((0 < (long)local_114) && (0 < local_118)) {
            std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::resize
                      (&local_128->d->layers,(long)local_114);
            std::vector<ncnn::Blob,_std::allocator<ncnn::Blob>_>::resize
                      (&pNVar9->d->blobs,(long)local_118);
            ParamDict::ParamDict(&local_e8);
            if (0 < local_114) {
              uVar20 = 0;
              local_d0 = dr;
              do {
                iVar10 = (*dr->_vptr_DataReader[3])(dr,&local_11c,4);
                if (CONCAT44(extraout_var_02,iVar10) != 4) {
                  load_param_bin();
LAB_00166626:
                  iVar10 = -1;
                  goto LAB_0016662b;
                }
                iVar10 = (*dr->_vptr_DataReader[3])(dr,&local_12c,4);
                if (CONCAT44(extraout_var_03,iVar10) != 4) {
                  load_param_bin();
                  goto LAB_00166626;
                }
                iVar10 = (*dr->_vptr_DataReader[3])(dr,&local_130,4);
                if (CONCAT44(extraout_var_04,iVar10) != 4) {
                  load_param_bin();
                  goto LAB_00166626;
                }
                pLVar11 = create_layer(local_11c);
                if (pLVar11 == (Layer *)0x0) {
                  iVar10 = (*local_128->_vptr_Net[4])(local_128,(ulong)(local_11c & 0xfffffeff));
                  pLVar11 = (Layer *)CONCAT44(extraout_var_05,iVar10);
                  if (pLVar11 == (Layer *)0x0) {
                    fprintf(_stderr,"layer %d not exists or registered",(ulong)local_11c);
                    fputc(10,_stderr);
                    clear(local_128);
                    goto LAB_00166626;
                  }
                }
                local_f0 = &pLVar11->bottoms;
                std::vector<int,_std::allocator<int>_>::resize(local_f0,(long)local_12c);
                if (0 < local_12c) {
                  lVar14 = 0;
                  do {
                    iVar10 = (*dr->_vptr_DataReader[3])(dr,&local_c0,4);
                    if (CONCAT44(extraout_var_06,iVar10) != 4) {
                      load_param_bin();
                      goto LAB_00166626;
                    }
                    (local_128->d->blobs).
                    super__Vector_base<ncnn::Blob,_std::allocator<ncnn::Blob>_>._M_impl.
                    super__Vector_impl_data._M_start[(int)local_c0.data].consumer = (int)uVar20;
                    (local_f0->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                    super__Vector_impl_data._M_start[lVar14] = (int)local_c0.data;
                    lVar14 = lVar14 + 1;
                  } while (lVar14 < local_12c);
                }
                local_100 = &pLVar11->tops;
                std::vector<int,_std::allocator<int>_>::resize(local_100,(long)local_130);
                if (0 < local_130) {
                  lVar14 = 0;
                  do {
                    iVar10 = (*dr->_vptr_DataReader[3])(dr,&local_c0,4);
                    if (CONCAT44(extraout_var_07,iVar10) != 4) {
                      load_param_bin();
                      goto LAB_00166626;
                    }
                    (local_128->d->blobs).
                    super__Vector_base<ncnn::Blob,_std::allocator<ncnn::Blob>_>._M_impl.
                    super__Vector_impl_data._M_start[(int)local_c0.data].producer = (int)uVar20;
                    (local_100->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                    super__Vector_impl_data._M_start[lVar14] = (int)local_c0.data;
                    lVar14 = lVar14 + 1;
                  } while (lVar14 < local_130);
                }
                iVar10 = ParamDict::load_param_bin(&local_e8,dr);
                if (iVar10 == 0) {
                  if (pLVar11->support_int8_storage == true) {
                    (local_128->opt).use_vulkan_compute = false;
                  }
                  local_78.cstep = 0;
                  local_78.data = (void *)0x0;
                  local_78.refcount._0_4_ = 0;
                  local_78.refcount._4_4_ = 0;
                  local_78.elemsize._0_4_ = 0;
                  local_78._20_8_ = 0;
                  local_78.h = 0;
                  local_78.d = 0;
                  local_78.c = 0;
                  local_78.allocator = (Allocator *)0x0;
                  local_78.dims = 0;
                  local_78.w = 0;
                  ParamDict::get(&local_c0,&local_e8,0x1e,&local_78);
                  piVar15 = (int *)CONCAT44(local_78.refcount._4_4_,local_78.refcount._0_4_);
                  local_108 = pLVar11;
                  if (piVar15 != (int *)0x0) {
                    LOCK();
                    *piVar15 = *piVar15 + -1;
                    UNLOCK();
                    if (*piVar15 == 0) {
                      if (local_78.allocator == (Allocator *)0x0) {
                        if (local_78.data != (void *)0x0) {
                          free(local_78.data);
                        }
                      }
                      else {
                        (*(local_78.allocator)->_vptr_Allocator[3])();
                      }
                    }
                  }
                  local_c8 = uVar20;
                  if (((CONCAT44(local_c0.data._4_4_,(int)local_c0.data) != 0) &&
                      ((long)local_c0.c * local_c0.cstep != 0)) && (0 < local_130)) {
                    piVar15 = (int *)(CONCAT44(local_c0.data._4_4_,(int)local_c0.data) + 0xc);
                    lVar14 = 0;
                    do {
                      iVar10 = (local_100->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                               super__Vector_impl_data._M_start[lVar14];
                      pBVar4 = (local_128->d->blobs).
                               super__Vector_base<ncnn::Blob,_std::allocator<ncnn::Blob>_>._M_impl.
                               super__Vector_impl_data._M_start;
                      iVar3 = piVar15[-3];
                      if (iVar3 == 3) {
                        uVar20 = (ulong)piVar15[-2];
                        iVar13 = piVar15[-1];
                        iVar18 = *piVar15;
                        sVar19 = (long)iVar13 * uVar20 + 3 & 0x3ffffffffffffffc;
                        pMVar12 = &pBVar4[iVar10].shape;
                        piVar5 = pBVar4[iVar10].shape.refcount;
                        iVar17 = 3;
                        if (piVar5 != (int *)0x0) {
                          LOCK();
                          *piVar5 = *piVar5 + -1;
                          UNLOCK();
                          if (*piVar5 == 0) {
                            pvVar16 = pBVar4[iVar10].shape.data;
                            pAVar6 = pBVar4[iVar10].shape.allocator;
                            if (pAVar6 == (Allocator *)0x0) {
LAB_0016626d:
                              pMVar12 = &pBVar4[iVar10].shape;
                              if (pvVar16 != (void *)0x0) {
                                local_120 = iVar18;
                                local_110 = uVar20;
                                local_d8 = &pBVar4[iVar10].shape;
                                free(pvVar16);
                                uVar20 = local_110;
                                pMVar12 = local_d8;
                                iVar18 = local_120;
                                iVar17 = iVar3;
                              }
                            }
                            else {
                              local_120 = iVar18;
                              local_110 = uVar20;
                              (*pAVar6->_vptr_Allocator[3])();
                              iVar17 = 3;
                              uVar20 = local_110;
                              iVar18 = local_120;
                            }
                          }
                        }
LAB_0016629b:
                        pMVar12->data = (void *)0x0;
                        pMVar12->refcount = (int *)0x0;
                        pBVar4[iVar10].shape.elemsize = 4;
                        pBVar4[iVar10].shape.elempack = 1;
                        pBVar4[iVar10].shape.allocator = (Allocator *)0x0;
                        pBVar4[iVar10].shape.dims = iVar17;
                        pBVar4[iVar10].shape.w = (int)uVar20;
                        pBVar4[iVar10].shape.h = iVar13;
                        pBVar4[iVar10].shape.d = 1;
                        pBVar4[iVar10].shape.c = iVar18;
                        pBVar4[iVar10].shape.cstep = sVar19;
                      }
                      else {
                        if (iVar3 == 2) {
                          uVar20 = (ulong)piVar15[-2];
                          iVar13 = piVar15[-1];
                          sVar19 = (long)iVar13 * uVar20;
                          pMVar12 = &pBVar4[iVar10].shape;
                          piVar5 = pBVar4[iVar10].shape.refcount;
                          iVar18 = 1;
                          iVar17 = 2;
                          if (piVar5 != (int *)0x0) {
                            LOCK();
                            *piVar5 = *piVar5 + -1;
                            UNLOCK();
                            if (*piVar5 == 0) {
                              pvVar16 = pBVar4[iVar10].shape.data;
                              pAVar6 = pBVar4[iVar10].shape.allocator;
                              if (pAVar6 == (Allocator *)0x0) goto LAB_0016626d;
                              local_110 = uVar20;
                              (*pAVar6->_vptr_Allocator[3])();
                              iVar17 = 2;
                              uVar20 = local_110;
                              iVar18 = 1;
                            }
                          }
                          goto LAB_0016629b;
                        }
                        if (iVar3 == 1) {
                          uVar20 = (ulong)(uint)piVar15[-2];
                          sVar19 = (size_t)piVar15[-2];
                          pMVar12 = &pBVar4[iVar10].shape;
                          piVar5 = pBVar4[iVar10].shape.refcount;
                          iVar17 = 1;
                          if (piVar5 != (int *)0x0) {
                            LOCK();
                            *piVar5 = *piVar5 + -1;
                            UNLOCK();
                            if (*piVar5 == 0) {
                              pvVar16 = pBVar4[iVar10].shape.data;
                              pAVar6 = pBVar4[iVar10].shape.allocator;
                              if (pAVar6 == (Allocator *)0x0) {
                                iVar13 = 1;
                                iVar18 = 1;
                                goto LAB_0016626d;
                              }
                              (*pAVar6->_vptr_Allocator[3])();
                              iVar13 = 1;
                              iVar18 = 1;
                              iVar17 = 1;
                              goto LAB_0016629b;
                            }
                          }
                          iVar13 = 1;
                          iVar18 = 1;
                          goto LAB_0016629b;
                        }
                      }
                      lVar14 = lVar14 + 1;
                      piVar15 = piVar15 + 4;
                    } while (lVar14 < local_130);
                  }
                  pvVar1 = &local_108->bottom_shapes;
                  std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::resize(pvVar1,(long)local_12c)
                  ;
                  if (0 < local_12c) {
                    lVar14 = 0;
                    lVar21 = 0;
                    iVar10 = local_12c;
                    do {
                      iVar3 = (local_f0->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                              super__Vector_impl_data._M_start[lVar21];
                      pBVar4 = (local_128->d->blobs).
                               super__Vector_base<ncnn::Blob,_std::allocator<ncnn::Blob>_>._M_impl.
                               super__Vector_impl_data._M_start;
                      pMVar7 = (pvVar1->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                               _M_impl.super__Vector_impl_data._M_start;
                      puVar2 = (undefined8 *)((long)&pMVar7->data + lVar14);
                      if ((Mat *)puVar2 != &pBVar4[iVar3].shape) {
                        piVar15 = pBVar4[iVar3].shape.refcount;
                        if (piVar15 != (int *)0x0) {
                          LOCK();
                          *piVar15 = *piVar15 + 1;
                          UNLOCK();
                        }
                        piVar15 = *(int **)((long)&pMVar7->refcount + lVar14);
                        if (piVar15 != (int *)0x0) {
                          LOCK();
                          *piVar15 = *piVar15 + -1;
                          UNLOCK();
                          if (*piVar15 == 0) {
                            pvVar16 = *(void **)((long)&pMVar7->data + lVar14);
                            plVar8 = *(long **)((long)&pMVar7->allocator + lVar14);
                            if (plVar8 == (long *)0x0) {
                              if (pvVar16 != (void *)0x0) {
                                free(pvVar16);
                              }
                            }
                            else {
                              (**(code **)(*plVar8 + 0x18))();
                            }
                          }
                        }
                        *(undefined8 *)((long)&pMVar7->cstep + lVar14) = 0;
                        *(undefined8 *)((long)puVar2 + 0xc) = 0;
                        *(undefined8 *)((long)puVar2 + 0x14) = 0;
                        *puVar2 = 0;
                        puVar2[1] = 0;
                        puVar2 = (undefined8 *)((long)&pMVar7->dims + lVar14);
                        *puVar2 = 0;
                        puVar2[1] = 0;
                        *(undefined4 *)((long)&pMVar7->c + lVar14) = 0;
                        piVar15 = pBVar4[iVar3].shape.refcount;
                        puVar2 = (undefined8 *)((long)&pMVar7->data + lVar14);
                        *puVar2 = pBVar4[iVar3].shape.data;
                        puVar2[1] = piVar15;
                        *(size_t *)((long)&pMVar7->elemsize + lVar14) = pBVar4[iVar3].shape.elemsize
                        ;
                        *(int *)((long)&pMVar7->elempack + lVar14) = pBVar4[iVar3].shape.elempack;
                        *(Allocator **)((long)&pMVar7->allocator + lVar14) =
                             pBVar4[iVar3].shape.allocator;
                        iVar10 = pBVar4[iVar3].shape.w;
                        iVar13 = pBVar4[iVar3].shape.h;
                        iVar18 = pBVar4[iVar3].shape.d;
                        piVar15 = (int *)((long)&pMVar7->dims + lVar14);
                        *piVar15 = pBVar4[iVar3].shape.dims;
                        piVar15[1] = iVar10;
                        piVar15[2] = iVar13;
                        piVar15[3] = iVar18;
                        *(int *)((long)&pMVar7->c + lVar14) = pBVar4[iVar3].shape.c;
                        *(size_t *)((long)&pMVar7->cstep + lVar14) = pBVar4[iVar3].shape.cstep;
                        iVar10 = local_12c;
                      }
                      lVar21 = lVar21 + 1;
                      lVar14 = lVar14 + 0x48;
                    } while (lVar21 < iVar10);
                  }
                  pvVar1 = &local_108->top_shapes;
                  std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::resize(pvVar1,(long)local_130)
                  ;
                  if (0 < local_130) {
                    lVar14 = 0;
                    lVar21 = 0;
                    iVar10 = local_130;
                    do {
                      iVar3 = (local_100->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                              super__Vector_impl_data._M_start[lVar21];
                      pBVar4 = (local_128->d->blobs).
                               super__Vector_base<ncnn::Blob,_std::allocator<ncnn::Blob>_>._M_impl.
                               super__Vector_impl_data._M_start;
                      pMVar7 = (pvVar1->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                               _M_impl.super__Vector_impl_data._M_start;
                      puVar2 = (undefined8 *)((long)&pMVar7->data + lVar14);
                      if ((Mat *)puVar2 != &pBVar4[iVar3].shape) {
                        piVar15 = pBVar4[iVar3].shape.refcount;
                        if (piVar15 != (int *)0x0) {
                          LOCK();
                          *piVar15 = *piVar15 + 1;
                          UNLOCK();
                        }
                        piVar15 = *(int **)((long)&pMVar7->refcount + lVar14);
                        if (piVar15 != (int *)0x0) {
                          LOCK();
                          *piVar15 = *piVar15 + -1;
                          UNLOCK();
                          if (*piVar15 == 0) {
                            pvVar16 = *(void **)((long)&pMVar7->data + lVar14);
                            plVar8 = *(long **)((long)&pMVar7->allocator + lVar14);
                            if (plVar8 == (long *)0x0) {
                              if (pvVar16 != (void *)0x0) {
                                free(pvVar16);
                              }
                            }
                            else {
                              (**(code **)(*plVar8 + 0x18))();
                            }
                          }
                        }
                        *(undefined8 *)((long)&pMVar7->cstep + lVar14) = 0;
                        *(undefined8 *)((long)puVar2 + 0xc) = 0;
                        *(undefined8 *)((long)puVar2 + 0x14) = 0;
                        *puVar2 = 0;
                        puVar2[1] = 0;
                        puVar2 = (undefined8 *)((long)&pMVar7->dims + lVar14);
                        *puVar2 = 0;
                        puVar2[1] = 0;
                        *(undefined4 *)((long)&pMVar7->c + lVar14) = 0;
                        piVar15 = pBVar4[iVar3].shape.refcount;
                        puVar2 = (undefined8 *)((long)&pMVar7->data + lVar14);
                        *puVar2 = pBVar4[iVar3].shape.data;
                        puVar2[1] = piVar15;
                        *(size_t *)((long)&pMVar7->elemsize + lVar14) = pBVar4[iVar3].shape.elemsize
                        ;
                        *(int *)((long)&pMVar7->elempack + lVar14) = pBVar4[iVar3].shape.elempack;
                        *(Allocator **)((long)&pMVar7->allocator + lVar14) =
                             pBVar4[iVar3].shape.allocator;
                        iVar10 = pBVar4[iVar3].shape.w;
                        iVar13 = pBVar4[iVar3].shape.h;
                        iVar18 = pBVar4[iVar3].shape.d;
                        piVar15 = (int *)((long)&pMVar7->dims + lVar14);
                        *piVar15 = pBVar4[iVar3].shape.dims;
                        piVar15[1] = iVar10;
                        piVar15[2] = iVar13;
                        piVar15[3] = iVar18;
                        *(int *)((long)&pMVar7->c + lVar14) = pBVar4[iVar3].shape.c;
                        *(size_t *)((long)&pMVar7->cstep + lVar14) = pBVar4[iVar3].shape.cstep;
                        iVar10 = local_130;
                      }
                      lVar21 = lVar21 + 1;
                      lVar14 = lVar14 + 0x48;
                    } while (lVar21 < iVar10);
                  }
                  pLVar11 = local_108;
                  iVar10 = (*local_108->_vptr_Layer[2])(local_108,&local_e8);
                  uVar20 = local_c8;
                  dr = local_d0;
                  if (iVar10 == 0) {
                    (local_128->d->layers).
                    super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>._M_impl.
                    super__Vector_impl_data._M_start[local_c8] = pLVar11;
                    iVar10 = 0;
                  }
                  else {
                    load_param_bin();
                    iVar10 = 0xe;
                  }
                  if (local_c0.refcount != (int *)0x0) {
                    LOCK();
                    *local_c0.refcount = *local_c0.refcount + -1;
                    UNLOCK();
                    if (*local_c0.refcount == 0) {
                      if (local_c0.allocator == (Allocator *)0x0) {
                        if ((void *)CONCAT44(local_c0.data._4_4_,(int)local_c0.data) != (void *)0x0)
                        {
                          free((void *)CONCAT44(local_c0.data._4_4_,(int)local_c0.data));
                        }
                      }
                      else {
                        (*(local_c0.allocator)->_vptr_Allocator[3])();
                      }
                    }
                  }
                  if ((iVar10 != 0xe) && (iVar10 != 0)) goto LAB_00166626;
                }
                else {
                  fprintf(_stderr,"ParamDict load_param %d %s failed",uVar20 & 0xffffffff,
                          (pLVar11->name)._M_dataplus._M_p);
                  fputc(10,_stderr);
                }
                uVar20 = uVar20 + 1;
              } while ((long)uVar20 < (long)local_114);
            }
            iVar10 = 0;
            NetPrivate::update_input_output_indexes(local_128->d);
LAB_0016662b:
            ParamDict::~ParamDict(&local_e8);
            return iVar10;
          }
          load_param_bin();
        }
        else {
          load_param_bin();
        }
      }
      else {
        load_param_bin();
      }
    }
    else {
      load_param_bin();
    }
  }
  else {
    load_param_bin();
  }
  return -1;
}

Assistant:

int Net::load_param_bin(const DataReader& dr)
{
#define READ_VALUE(buf)                            \
    if (dr.read(&buf, sizeof(buf)) != sizeof(buf)) \
    {                                              \
        NCNN_LOGE("read " #buf " failed");         \
        return -1;                                 \
    }

    int magic = 0;
    READ_VALUE(magic)
    if (magic != 7767517)
    {
        NCNN_LOGE("param is too old, please regenerate");
        return -1;
    }

    int layer_count = 0;
    int blob_count = 0;
    READ_VALUE(layer_count)
    READ_VALUE(blob_count)
    if (layer_count <= 0 || blob_count <= 0)
    {
        NCNN_LOGE("invalid layer_count or blob_count");
        return -1;
    }

    d->layers.resize(layer_count);
    d->blobs.resize(blob_count);

#if NCNN_VULKAN
    // TODO enable gpu when bf16 conversion implemented
    if (opt.use_bf16_storage)
        opt.use_vulkan_compute = false;

    if (opt.use_vulkan_compute)
    {
        if (!d->vkdev) d->vkdev = get_gpu_device();
        if (!d->vkdev) opt.use_vulkan_compute = false; // no vulkan device, fallback to cpu
    }
    if (opt.use_vulkan_compute)
    {
        // sanitize use options
        if (!d->vkdev->info.support_fp16_packed()) opt.use_fp16_packed = false;
        if (!d->vkdev->info.support_fp16_storage()) opt.use_fp16_storage = false;
        if (!d->vkdev->info.support_fp16_arithmetic()) opt.use_fp16_arithmetic = false;
        if (!d->vkdev->info.support_int8_storage()) opt.use_int8_storage = false;
        if (!d->vkdev->info.support_int8_arithmetic()) opt.use_int8_arithmetic = false;
        if (!d->vkdev->info.support_cooperative_matrix()) opt.use_cooperative_matrix = false;

        if (d->vkdev->info.bug_buffer_image_load_zero()) opt.use_image_storage = false;

        // enable local memory optimization on discrete gpu only
        if (d->vkdev->info.type() != 0) opt.use_shader_local_memory = false;

        // fp16a makes no sense when fp16 storage disabled
        if (!opt.use_fp16_packed && !opt.use_fp16_storage) opt.use_fp16_arithmetic = false;
    }
    else
    {
        // fp16a makes no sense when fp16 storage disabled
        if (!opt.use_fp16_storage) opt.use_fp16_arithmetic = false;
    }
#endif // NCNN_VULKAN

    ParamDict pd;

    for (int i = 0; i < layer_count; i++)
    {
        int typeindex;
        int bottom_count;
        int top_count;
        READ_VALUE(typeindex)
        READ_VALUE(bottom_count)
        READ_VALUE(top_count)

        Layer* layer = create_layer(typeindex);
        if (!layer)
        {
            int custom_index = typeindex & ~LayerType::CustomBit;
            layer = create_custom_layer(custom_index);
        }
        if (!layer)
        {
            NCNN_LOGE("layer %d not exists or registered", typeindex);
            clear();
            return -1;
        }

#if NCNN_VULKAN
        if (opt.use_vulkan_compute)
            layer->vkdev = d->vkdev;
#endif // NCNN_VULKAN

        //         layer->type = std::string(layer_type);
        //         layer->name = std::string(layer_name);
        //         NCNN_LOGE("new layer %d", typeindex);

        layer->bottoms.resize(bottom_count);
        for (int j = 0; j < bottom_count; j++)
        {
            int bottom_blob_index;
            READ_VALUE(bottom_blob_index)

            Blob& blob = d->blobs[bottom_blob_index];

            blob.consumer = i;

            layer->bottoms[j] = bottom_blob_index;
        }

        layer->tops.resize(top_count);
        for (int j = 0; j < top_count; j++)
        {
            int top_blob_index;
            READ_VALUE(top_blob_index)

            Blob& blob = d->blobs[top_blob_index];

            //             blob.name = std::string(blob_name);
            //             NCNN_LOGE("new blob %s", blob_name);

            blob.producer = i;

            layer->tops[j] = top_blob_index;
        }

        // layer specific params
        int pdlr = pd.load_param_bin(dr);
        if (pdlr != 0)
        {
#if NCNN_STRING
            NCNN_LOGE("ParamDict load_param %d %s failed", i, layer->name.c_str());
#else
            NCNN_LOGE("ParamDict load_param %d failed", i);
#endif
            continue;
        }

        if (layer->support_int8_storage)
        {
            // no int8 gpu support yet
            opt.use_vulkan_compute = false;
        }

        // pull out top blob shape hints
        Mat shape_hints = pd.get(30, Mat());
        if (!shape_hints.empty())
        {
            const int* psh = shape_hints;
            for (int j = 0; j < top_count; j++)
            {
                Blob& blob = d->blobs[layer->tops[j]];

                int dims = psh[0];
                if (dims == 1)
                {
                    blob.shape = Mat(psh[1], (void*)0, 4u, 1);
                }
                if (dims == 2)
                {
                    blob.shape = Mat(psh[1], psh[2], (void*)0, 4u, 1);
                }
                if (dims == 3)
                {
                    blob.shape = Mat(psh[1], psh[2], psh[3], (void*)0, 4u, 1);
                }

                psh += 4;
            }
        }

        // set bottom and top shape hints
        layer->bottom_shapes.resize(bottom_count);
        for (int j = 0; j < bottom_count; j++)
        {
            layer->bottom_shapes[j] = d->blobs[layer->bottoms[j]].shape;
        }

        layer->top_shapes.resize(top_count);
        for (int j = 0; j < top_count; j++)
        {
            layer->top_shapes[j] = d->blobs[layer->tops[j]].shape;
        }

        int lr = layer->load_param(pd);
        if (lr != 0)
        {
#if NCNN_STRING
            NCNN_LOGE("layer load_param %d %s failed", i, layer->name.c_str());
#else
            NCNN_LOGE("layer load_param %d failed", i);
#endif
            continue;
        }

        d->layers[i] = layer;
    }

    d->update_input_output_indexes();

#undef READ_VALUE
    return 0;
}